

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::internal::BenchmarkImp::UseRealTime(BenchmarkImp *this)

{
  ostream *poVar1;
  char *in_RDI;
  bool bVar2;
  undefined8 in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd8;
  CheckHandler *in_stack_ffffffffffffffe0;
  CheckHandler local_10 [2];
  
  bVar2 = (in_RDI[0x55] & 1U) != 0;
  if (bVar2) {
    CheckHandler::CheckHandler
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI,in_stack_ffffffffffffffc8,
               (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    poVar1 = CheckHandler::GetLog(local_10);
  }
  else {
    poVar1 = GetNullLogInstance();
  }
  std::operator<<(poVar1,"Cannot set UseRealTime and UseManualTime simultaneously.");
  if (!bVar2) {
    in_RDI[0x54] = '\x01';
    return;
  }
  CheckHandler::~CheckHandler((CheckHandler *)&LAB_001667db);
}

Assistant:

void BenchmarkImp::UseRealTime() {
  CHECK(!use_manual_time_) << "Cannot set UseRealTime and UseManualTime simultaneously.";
  use_real_time_ = true;
}